

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>
               (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>
                *m)

{
  _List_node_base *p_Var1;
  pointer puVar2;
  pointer pvVar3;
  undefined1 local_16c [4];
  int *local_168;
  _List_node_base **local_160;
  int local_154;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  int **local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined8 *local_120;
  _List_node_base ***local_118;
  undefined1 local_110;
  undefined8 local_108;
  shared_count sStack_100;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>
            (&columns,m);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x388);
  local_16c = SUB84((m->matrix_).matrix_._M_h._M_element_count,0);
  local_160 = (_List_node_base **)local_16c;
  local_168 = &local_154;
  local_154 = 7;
  local_110 = local_16c == (undefined1  [4])0x7;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_118 = &local_160;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_001a3550;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_168;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_001a35a0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_100);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x38a);
  p_Var1 = *(_List_node_base **)
            ((long)&(m->matrix_).super_Chain_vine_swap_option.super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                    .barcode_.
                    super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl + 8);
  local_16c = (undefined1  [4])0x6;
  local_110 = *(int *)&p_Var1[1]._M_prev == 6;
  local_160 = &p_Var1[1]._M_prev;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_148 = 0;
  local_130 = &PTR__lazy_ostream_001a3550;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_160;
  local_168 = (int *)local_16c;
  local_150 = &PTR__lazy_ostream_001a35a0;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_168;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_100);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  ::remove_maximal_cell(&m->matrix_,6);
  puVar2 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar3 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar3->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar3 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,false>>>
            (&columns,m);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x396);
  local_16c = SUB84((m->matrix_).matrix_._M_h._M_element_count,0);
  local_110 = local_16c == (undefined1  [4])0x6;
  local_168 = &local_154;
  local_154 = 6;
  local_128 = 0;
  local_148 = 0;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_150 = &PTR__lazy_ostream_001a35a0;
  local_160 = (_List_node_base **)local_16c;
  local_130 = &PTR__lazy_ostream_001a3550;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_160;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_168;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_100);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x399);
  p_Var1 = *(_List_node_base **)
            ((long)&(m->matrix_).super_Chain_vine_swap_option.super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
                    .barcode_.
                    super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl + 8);
  local_16c = (undefined1  [4])0xffffffff;
  local_110 = *(int *)&p_Var1[1]._M_prev == -1;
  local_160 = &p_Var1[1]._M_prev;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_001a3550;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_160;
  local_168 = (int *)local_16c;
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_001a3550;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = &local_168;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_100);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_chain_maximal_simplex_removal(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);
  }

  if constexpr (Matrix::Option_list::has_vine_update && Matrix::Option_list::has_map_column_container &&
                Matrix::Option_list::has_column_pairings) {
    m.remove_maximal_cell(6);
  } else {
    m.remove_last();
  }

  columns.pop_back();
  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death,
                      Matrix::template get_null_value<typename Matrix::ID_index>());
  }
}